

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editor.cpp
# Opt level: O0

int __thiscall
CEditor::DoButton_ButtonInc
          (CEditor *this,void *pID,char *pText,int Checked,CUIRect *pRect,int Flags,char *pToolTip)

{
  int iVar1;
  CEditor *this_00;
  long in_RDX;
  CEditor *in_RDI;
  CUI *in_R8;
  long in_FS_OFFSET;
  vec4 vVar2;
  int in_stack_ffffffffffffff84;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  CEditor *in_stack_ffffffffffffffa8;
  CUI *this_01;
  CUIRect *this_02;
  
  this_02 = *(CUIRect **)(in_FS_OFFSET + 0x28);
  this_01 = in_R8;
  vVar2 = GetButtonColor(in_stack_ffffffffffffffa8,in_RDI,(int)((ulong)in_R8 >> 0x20));
  CUIRect::Draw(this_02,vVar2._8_8_,vVar2.field_1.y,(int)vVar2.field_0);
  this_00 = (CEditor *)UI(in_RDI);
  if (in_RDX == 0) {
    in_RDX = 0;
  }
  CUI::DoLabel(this_01,(CUIRect *)this_00,(char *)in_RDI,(float)((ulong)in_R8 >> 0x20),(int)in_R8,
               (float)((ulong)in_RDX >> 0x20),SUB81((ulong)in_RDX >> 0x18,0));
  iVar1 = DoButton_Editor_Common
                    (this_00,in_RDI,&in_R8->m_Enabled,(int)((ulong)in_RDX >> 0x20),
                     (CUIRect *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                     in_stack_ffffffffffffff84,&this_01->m_Enabled);
  if (*(CUIRect **)(in_FS_OFFSET + 0x28) != this_02) {
    __stack_chk_fail();
  }
  return iVar1;
}

Assistant:

int CEditor::DoButton_ButtonInc(const void *pID, const char *pText, int Checked, const CUIRect *pRect, int Flags, const char *pToolTip)
{
	pRect->Draw(GetButtonColor(pID, Checked), 3.0f, CUIRect::CORNER_R);
	UI()->DoLabel(pRect, pText?pText:"+", 10.0f, TEXTALIGN_MC);
	return DoButton_Editor_Common(pID, pText, Checked, pRect, Flags, pToolTip);
}